

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall
wallet::CWallet::ChangeWalletPassphrase
          (CWallet *this,SecureString *strOldWalletPassphrase,SecureString *strNewWalletPassphrase)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> ciphertext;
  span<const_unsigned_char,_18446744073709551615UL> salt;
  span<const_unsigned_char,_18446744073709551615UL> salt_00;
  span<const_unsigned_char,_18446744073709551615UL> salt_01;
  span<const_unsigned_char,_18446744073709551615UL> salt_02;
  bool bVar2;
  bool bVar3;
  undefined1 uVar4;
  reference ppVar5;
  type vchPlaintext;
  type this_00;
  CWallet *in_RDX;
  size_t in_RSI;
  long in_FS_OFFSET;
  duration<double,_std::ratio<1L,_1000L>_> this_01;
  CCrypter *this_02;
  duration<double,_std::ratio<1L,_1000L>_> params;
  WalletBatch *this_03;
  value_type *pMasterKey;
  MasterKeyMap *__range2;
  bool fWasLocked;
  time_point start;
  MillisecondsDouble target;
  iterator __end2;
  iterator __begin2;
  CKeyingMaterial _vMasterKey;
  CCrypter crypter;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  CWallet *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  duration<double,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  CCrypter *in_stack_fffffffffffffe08;
  CWallet *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  uint uVar6;
  undefined8 in_stack_fffffffffffffe20;
  SecureString *in_stack_fffffffffffffe28;
  CCrypter *in_stack_fffffffffffffe30;
  CCrypter *in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe48;
  undefined6 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe56;
  undefined1 in_stack_fffffffffffffe57;
  __extent_storage<18446744073709551615UL> wallet_fmt;
  byte local_131;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsLocked((CWallet *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe10,
             (char *)in_stack_fffffffffffffe08,
             (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
             (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x18,0));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe10,
             (char *)in_stack_fffffffffffffe08,
             (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
             (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffdf8 >> 0x18,0));
  Lock(in_stack_fffffffffffffe10);
  CCrypter::CCrypter(in_stack_fffffffffffffe08);
  std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  std::
  map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
  ::begin((map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
           *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  std::
  map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
  ::end((map<unsigned_int,_wallet::CMasterKey,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>_>
         *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
  do {
    bVar3 = std::operator==((_Self *)in_stack_fffffffffffffde8,
                            (_Self *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      bVar2 = false;
LAB_001a6d79:
      std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                 in_stack_fffffffffffffde8);
      CCrypter::~CCrypter((CCrypter *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8))
      ;
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
      if (!bVar2) {
        local_131 = 0;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return (bool)(local_131 & 1);
    }
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_unsigned_int,_wallet::CMasterKey>_> *)
                        CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
    wallet_fmt._M_extent_value = in_RSI;
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
              ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffde8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    salt._M_ptr._6_1_ = in_stack_fffffffffffffe56;
    salt._M_ptr._0_6_ = in_stack_fffffffffffffe50;
    salt._M_ptr._7_1_ = in_stack_fffffffffffffe57;
    salt._M_extent._M_extent_value = wallet_fmt._M_extent_value;
    bVar3 = CCrypter::SetKeyFromPassphrase
                      (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,salt,
                       (uint)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                       (uint)in_stack_fffffffffffffe20);
    if (!bVar3) {
      local_131 = 0;
      bVar2 = true;
      goto LAB_001a6d79;
    }
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
              ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffde8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    ciphertext._M_extent._M_extent_value._0_6_ = in_stack_fffffffffffffe50;
    ciphertext._M_ptr = (pointer)in_stack_fffffffffffffe48;
    ciphertext._M_extent._M_extent_value._6_1_ = in_stack_fffffffffffffe56;
    ciphertext._M_extent._M_extent_value._7_1_ = in_stack_fffffffffffffe57;
    in_stack_fffffffffffffe57 =
         CCrypter::Decrypt(in_stack_fffffffffffffe38,ciphertext,&in_stack_fffffffffffffe30->vchKey);
    if (!(bool)in_stack_fffffffffffffe57) {
      local_131 = 0;
      bVar2 = true;
      goto LAB_001a6d79;
    }
    in_stack_fffffffffffffe56 = Unlock(in_stack_fffffffffffffe10,&in_stack_fffffffffffffe08->vchKey)
    ;
    if ((bool)in_stack_fffffffffffffe56) {
      std::chrono::_V2::steady_clock::now();
      std::span<const_unsigned_char,_18446744073709551615UL>::
      span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffde8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
      salt_00._M_ptr._6_1_ = in_stack_fffffffffffffe56;
      salt_00._M_ptr._0_6_ = in_stack_fffffffffffffe50;
      salt_00._M_ptr._7_1_ = in_stack_fffffffffffffe57;
      salt_00._M_extent._M_extent_value = wallet_fmt._M_extent_value;
      CCrypter::SetKeyFromPassphrase
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,salt_00,
                 (uint)((ulong)in_stack_fffffffffffffe20 >> 0x20),(uint)in_stack_fffffffffffffe20);
      this_01 = std::chrono::operator*
                          ((uint *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                           (duration<double,_std::ratio<1L,_1000L>_> *)
                           CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
      std::chrono::_V2::steady_clock::now();
      vchPlaintext = std::chrono::operator-
                               ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                                (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
      this_02 = (CCrypter *)
                std::chrono::operator/
                          (in_stack_fffffffffffffdf8,
                           (duration<long,_std::ratio<1L,_1000000000L>_> *)
                           CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      (ppVar5->second).nDeriveIterations = (uint)(long)(double)this_02;
      std::chrono::_V2::steady_clock::now();
      std::span<const_unsigned_char,_18446744073709551615UL>::
      span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffde8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
      salt_01._M_ptr._6_1_ = in_stack_fffffffffffffe56;
      salt_01._M_ptr._0_6_ = in_stack_fffffffffffffe50;
      salt_01._M_ptr._7_1_ = in_stack_fffffffffffffe57;
      salt_01._M_extent._M_extent_value = wallet_fmt._M_extent_value;
      CCrypter::SetKeyFromPassphrase
                (this_02,(SecureString *)in_RDX,salt_01,
                 (uint)((ulong)in_stack_fffffffffffffe20 >> 0x20),(uint)in_stack_fffffffffffffe20);
      uVar6 = (ppVar5->second).nDeriveIterations;
      params = std::chrono::operator*
                         ((uint *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                          (duration<double,_std::ratio<1L,_1000L>_> *)
                          CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
      std::chrono::_V2::steady_clock::now();
      this_00 = std::chrono::operator-
                          ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
                           (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
      this_03 = (WalletBatch *)
                std::chrono::operator/
                          (in_stack_fffffffffffffdf8,
                           (duration<long,_std::ratio<1L,_1000000000L>_> *)
                           CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
      (ppVar5->second).nDeriveIterations = uVar6 + (int)(long)(double)this_03 >> 1;
      if ((ppVar5->second).nDeriveIterations < 25000) {
        (ppVar5->second).nDeriveIterations = 25000;
      }
      WalletLogPrintf<unsigned_int>
                (in_RDX,(ConstevalFormatString<1U>)wallet_fmt._M_extent_value,(uint *)params.__r);
      std::span<const_unsigned_char,_18446744073709551615UL>::
      span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffde8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
      salt_02._M_ptr._6_1_ = in_stack_fffffffffffffe56;
      salt_02._M_ptr._0_6_ = in_stack_fffffffffffffe50;
      salt_02._M_ptr._7_1_ = in_stack_fffffffffffffe57;
      salt_02._M_extent._M_extent_value = wallet_fmt._M_extent_value;
      uVar4 = CCrypter::SetKeyFromPassphrase
                        (this_02,(SecureString *)in_RDX,salt_02,(uint)((ulong)params.__r >> 0x20),
                         SUB84(params.__r,0));
      if ((bool)uVar4) {
        bVar3 = CCrypter::Encrypt((CCrypter *)this_01.__r,(CKeyingMaterial *)vchPlaintext.__r,
                                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
        if (bVar3) {
          in_stack_fffffffffffffde8 = (CWallet *)GetDatabase(in_stack_fffffffffffffde8);
          WalletBatch::WalletBatch
                    ((WalletBatch *)in_stack_fffffffffffffde8,
                     (WalletDatabase *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0)
                     ,(bool)in_stack_fffffffffffffddf);
          WalletBatch::WriteMasterKey
                    (this_03,(uint)((ulong)this_00.__r >> 0x20),
                     (CMasterKey *)CONCAT17(uVar4,in_stack_fffffffffffffe00));
          WalletBatch::~WalletBatch
                    ((WalletBatch *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
          if (bVar2) {
            Lock((CWallet *)this_00.__r);
          }
          local_131 = 1;
          bVar2 = true;
        }
        else {
          local_131 = 0;
          bVar2 = true;
        }
      }
      else {
        local_131 = 0;
        bVar2 = true;
      }
      goto LAB_001a6d79;
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_wallet::CMasterKey>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_unsigned_int,_wallet::CMasterKey>_> *)
               CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  } while( true );
}

Assistant:

bool CWallet::ChangeWalletPassphrase(const SecureString& strOldWalletPassphrase, const SecureString& strNewWalletPassphrase)
{
    bool fWasLocked = IsLocked();

    {
        LOCK2(m_relock_mutex, cs_wallet);
        Lock();

        CCrypter crypter;
        CKeyingMaterial _vMasterKey;
        for (MasterKeyMap::value_type& pMasterKey : mapMasterKeys)
        {
            if(!crypter.SetKeyFromPassphrase(strOldWalletPassphrase, pMasterKey.second.vchSalt, pMasterKey.second.nDeriveIterations, pMasterKey.second.nDerivationMethod))
                return false;
            if (!crypter.Decrypt(pMasterKey.second.vchCryptedKey, _vMasterKey))
                return false;
            if (Unlock(_vMasterKey))
            {
                constexpr MillisecondsDouble target{100};
                auto start{SteadyClock::now()};
                crypter.SetKeyFromPassphrase(strNewWalletPassphrase, pMasterKey.second.vchSalt, pMasterKey.second.nDeriveIterations, pMasterKey.second.nDerivationMethod);
                pMasterKey.second.nDeriveIterations = static_cast<unsigned int>(pMasterKey.second.nDeriveIterations * target / (SteadyClock::now() - start));

                start = SteadyClock::now();
                crypter.SetKeyFromPassphrase(strNewWalletPassphrase, pMasterKey.second.vchSalt, pMasterKey.second.nDeriveIterations, pMasterKey.second.nDerivationMethod);
                pMasterKey.second.nDeriveIterations = (pMasterKey.second.nDeriveIterations + static_cast<unsigned int>(pMasterKey.second.nDeriveIterations * target / (SteadyClock::now() - start))) / 2;

                if (pMasterKey.second.nDeriveIterations < 25000)
                    pMasterKey.second.nDeriveIterations = 25000;

                WalletLogPrintf("Wallet passphrase changed to an nDeriveIterations of %i\n", pMasterKey.second.nDeriveIterations);

                if (!crypter.SetKeyFromPassphrase(strNewWalletPassphrase, pMasterKey.second.vchSalt, pMasterKey.second.nDeriveIterations, pMasterKey.second.nDerivationMethod))
                    return false;
                if (!crypter.Encrypt(_vMasterKey, pMasterKey.second.vchCryptedKey))
                    return false;
                WalletBatch(GetDatabase()).WriteMasterKey(pMasterKey.first, pMasterKey.second);
                if (fWasLocked)
                    Lock();
                return true;
            }
        }
    }

    return false;
}